

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* list_dirs(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  path *ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  directory_iterator local_88;
  directory_iterator local_78;
  path local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_68,path);
  std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            (&local_78,&local_68,none,(error_code *)0x0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_68);
  if (local_78._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_78._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_78._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_88._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_78._M_dir.
           super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_88._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_78._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_78._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_78._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_dir.
       super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_78._M_dir.
            super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_78._M_dir.
        super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78._M_dir.
                 super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  paVar1 = &local_68._M_pathname.field_2;
  while (local_88._M_dir.
         super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ppVar4 = (path *)std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*
                               (&local_88);
    cVar3 = std::experimental::filesystem::v1::status(ppVar4);
    if (cVar3 == '\x02') {
      pcVar2 = (ppVar4->_M_pathname)._M_dataplus._M_p;
      local_68._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + (ppVar4->_M_pathname)._M_string_length);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_68._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_pathname._M_dataplus._M_p);
      }
    }
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++(&local_88);
  }
  if (local_78._M_dir.
      super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._M_dir.
               super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> list_dirs(std::string path) {
    std::vector<std::string> result;
    for (auto & p : fs::directory_iterator(path)) {
        if (fs::is_directory(p)) {
            result.push_back(std::string(p.path()));
        }
    }
    return result;
}